

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O1

void test_2d_static<15ul,30ul>(void)

{
  long lVar1;
  value_type true_idx;
  tuple<int,_int> dptr [450];
  _Head_base<1UL,_int,_false> local_e68;
  _Head_base<0UL,_int,_false> local_e64;
  _Tuple_impl<0UL,_int,_int> *local_e60;
  _Tuple_impl<0UL,_int,_int> *local_e58;
  _Tuple_impl<0UL,_int,_int> *local_e50;
  _Tuple_impl<0UL,_int,_int> local_e48 [451];
  
  local_e48[0].super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl._0_1_ = 1;
  local_e60._0_1_ = 1;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x5f,"void test_2d_static() [X = 15UL, Y = 30UL]",(bool *)local_e48,(bool *)&local_e60
            );
  local_e48[0].super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl._0_1_ = 0;
  local_e60._0_1_ = 0;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x61,"void test_2d_static() [X = 15UL, Y = 30UL]",(bool *)local_e48,(bool *)&local_e60
            );
  local_e48[0] = (_Tuple_impl<0UL,_int,_int>)((ulong)(uint7)local_e48[0]._1_7_ << 8);
  local_e60 = (_Tuple_impl<0UL,_int,_int> *)((ulong)local_e60._1_7_ << 8);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x62,"void test_2d_static() [X = 15UL, Y = 30UL]",(bool *)local_e48,(bool *)&local_e60
            );
  local_e48[0].super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0x1;
  local_e48[0].super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  local_e60 = (_Tuple_impl<0UL,_int,_int> *)CONCAT44(local_e60._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,100,"void test_2d_static() [X = 15UL, Y = 30UL]",(unsigned_long *)local_e48,
             (int *)&local_e60);
  local_e48[0].super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0xf;
  local_e48[0].super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  local_e60 = (_Tuple_impl<0UL,_int,_int> *)0xf;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x65,"void test_2d_static() [X = 15UL, Y = 30UL]",(unsigned_long *)local_e48,
             (unsigned_long *)&local_e60);
  local_e48[0].super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0x1c2;
  local_e48[0].super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  local_e60 = (_Tuple_impl<0UL,_int,_int> *)0x1c2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x67,"void test_2d_static() [X = 15UL, Y = 30UL]",(unsigned_long *)local_e48,
             (unsigned_long *)&local_e60);
  local_e48[0].super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)0x1c2;
  local_e48[0].super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  local_e60 = (_Tuple_impl<0UL,_int,_int> *)0x1c2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x68,"void test_2d_static() [X = 15UL, Y = 30UL]",(unsigned_long *)local_e48,
             (unsigned_long *)&local_e60);
  memset(local_e48,0,0xe10);
  local_e68._M_head_impl = 0;
  do {
    local_e64._M_head_impl = 0;
    do {
      local_e60 = (_Tuple_impl<0UL,_int,_int> *)
                  ((long)local_e68._M_head_impl * 0xf + (ulong)(uint)local_e64._M_head_impl);
      local_e58 = local_e60;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x72,"void test_2d_static() [X = 15UL, Y = 30UL]",(unsigned_long *)&local_e58,
                 (unsigned_long *)&local_e60);
      local_e58 = local_e48 + (long)local_e68._M_head_impl * 0xf + (long)local_e64._M_head_impl;
      local_e50 = local_e48 + (long)local_e60;
      boost::detail::test_eq_impl<std::tuple<int,int>*,std::tuple<int,int>*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x74,"void test_2d_static() [X = 15UL, Y = 30UL]",(tuple<int,_int> **)&local_e58,
                 (tuple<int,_int> **)&local_e50);
      lVar1 = (long)local_e68._M_head_impl * 0xf + (long)local_e64._M_head_impl;
      local_e48[lVar1].super__Head_base<0UL,_int,_false>._M_head_impl = local_e64._M_head_impl;
      local_e48[lVar1].super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           local_e68._M_head_impl;
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(dptr[l.index(i, j)]))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x79,"void test_2d_static() [X = 15UL, Y = 30UL]",
                 &local_e48[lVar1].super__Head_base<0UL,_int,_false>._M_head_impl,
                 &local_e64._M_head_impl);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(dptr[l.index(i, j)]))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                 ,0x7a,"void test_2d_static() [X = 15UL, Y = 30UL]",
                 (int *)(local_e48 +
                        (long)local_e68._M_head_impl * 0xf + (long)local_e64._M_head_impl),
                 &local_e68._M_head_impl);
      local_e64._M_head_impl = local_e64._M_head_impl + 1;
    } while ((uint)local_e64._M_head_impl < 0xf);
    local_e68._M_head_impl = local_e68._M_head_impl + 1;
  } while ((uint)local_e68._M_head_impl < 0x1e);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    tuple<int, int> dptr[X * Y];

    // Set all elements to a unique value.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j)]) = i;
        std::get<1>(dptr[l.index(i, j)]) = j;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j)])), j); 
    }
}